

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error asmjit::v1_14::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  long lVar1;
  bool bVar2;
  Error EVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint64_t *extraout_RDX;
  ulong uVar7;
  Error unaff_EBP;
  long lVar8;
  bool bVar9;
  uint64_t value [2];
  uint64_t v;
  Environment local_50;
  ulong local_48;
  ulong local_40;
  Environment local_38;
  
  lVar8 = 1;
  bVar9 = false;
  local_50 = (Environment)exp;
  do {
    switch((&(self->_environment)._arch)[lVar8]) {
    case kUnknown:
      local_38._arch = kUnknown;
      local_38._subArch = kHost;
      local_38._vendor = kHost;
      local_38._platform = kUnknown;
      local_38._platformABI = kUnknown;
      local_38._objectFormat = kUnknown;
      local_38._floatABI = kHardFloat;
      local_38._reserved = '\0';
      break;
    case k32BitMask:
      local_38 = (&self->_environment)[lVar8];
      break;
    case kHost:
      lVar1 = *(long *)((long)(&self->_environment)[lVar8] + 0x20);
      if (lVar1 != 0) {
        local_38 = (Environment)
                   (*(long *)((long)(&self->_environment)[lVar8] + 0x18) + *(long *)(lVar1 + 0x10));
        break;
      }
      EVar3 = 0x43;
LAB_00119b74:
      unaff_EBP = EVar3;
      bVar2 = false;
      goto LAB_00119b76;
    case kRISCV32:
      EVar3 = CodeHolder_evaluateExpression
                        ((CodeHolder *)(&self->_environment)[lVar8],(Expression *)&local_38,out);
      out = extraout_RDX;
      if (EVar3 != 0) goto LAB_00119b74;
      break;
    default:
      bVar2 = false;
      unaff_EBP = 3;
      goto LAB_00119b76;
    }
    (&local_50)[lVar8] = local_38;
    bVar2 = true;
LAB_00119b76:
    if (!bVar2) break;
    lVar8 = lVar8 + 1;
    bVar9 = lVar8 != 2;
  } while (lVar8 == 2);
  if (!bVar9) {
    return unaff_EBP;
  }
  bVar5 = (byte)local_40;
  switch((self->_environment)._arch) {
  case kUnknown:
    uVar4 = local_40 + local_48;
    break;
  case k32BitMask:
    uVar4 = local_48 - local_40;
    break;
  case kHost:
    uVar4 = local_40 * local_48;
    break;
  case kRISCV32:
    uVar7 = local_48 << (bVar5 & 0x3f);
    goto LAB_00119be8;
  case kRISCV64:
    uVar7 = local_48 >> (bVar5 & 0x3f);
LAB_00119be8:
    uVar4 = 0;
    if (local_40 < 0x40) {
      uVar4 = uVar7;
    }
    break;
  case kARM:
    bVar6 = 0x3f;
    if (local_40 < 0x3f) {
      bVar6 = bVar5;
    }
    uVar4 = (long)local_48 >> (bVar6 & 0x3f);
    break;
  default:
    return 3;
  }
  *(ulong *)local_50 = uVar4;
  return 0;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case ExpressionValueType::kNone: {
        v = 0;
        break;
      }

      case ExpressionValueType::kConstant: {
        v = exp->value[i].constant;
        break;
      }

      case ExpressionValueType::kLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case ExpressionValueType::kExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case ExpressionOpType::kAdd:
      result = a + b;
      break;

    case ExpressionOpType::kSub:
      result = a - b;
      break;

    case ExpressionOpType::kMul:
      result = a * b;
      break;

    case ExpressionOpType::kSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case ExpressionOpType::kSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case ExpressionOpType::kSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}